

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseSkeletonElement
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,int iTime)

{
  Animation *pAVar1;
  bool bVar2;
  Logger *this_00;
  ulong uVar3;
  size_type sVar4;
  aiMatrix4x4t<float> local_170;
  undefined1 local_130 [8];
  aiMatrix4x4 mTemp;
  MatrixKey *key;
  reference local_48;
  Bone *bone;
  uint iBone;
  aiVector3D vRot;
  aiVector3D vPos;
  int iTime_local;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  vPos.y = (float)iTime;
  unique0x10000469 = szCurrentOut;
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vRot.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&bone + 4));
  bone._0_4_ = 0;
  bVar2 = ParseUnsignedInt(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                           (uint *)&bone);
  if (bVar2) {
    uVar3 = (ulong)(uint)bone;
    sVar4 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size(&this->asBones)
    ;
    if (uVar3 < sVar4) {
      local_48 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                           (&this->asBones,(ulong)(uint)bone);
      pAVar1 = &local_48->sAnim;
      memset(&key,0,0xa0);
      SMD::Bone::Animation::MatrixKey::MatrixKey((MatrixKey *)&key);
      std::
      vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
      ::push_back(&pAVar1->asKeys,(value_type *)&key);
      mTemp._56_8_ = std::
                     vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                     ::back(&(local_48->sAnim).asKeys);
      ((reference)mTemp._56_8_)->dTime = (double)(int)vPos.y;
      bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,&vRot.y);
      if (bVar2) {
        bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,&vRot.z);
        if (bVar2) {
          bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,&vPos.x);
          if (bVar2) {
            bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                               (float *)((long)&bone + 4));
            if (bVar2) {
              bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                                 (float *)&iBone);
              if (bVar2) {
                bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                                   &vRot.x);
                if (bVar2) {
                  aiMatrix4x4t<float>::FromEulerAnglesXYZ
                            ((aiMatrix4x4t<float> *)mTemp._56_8_,bone._4_4_,(float)iBone,vRot.x);
                  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_130);
                  mTemp.a2 = vRot.y;
                  mTemp.b2 = vRot.z;
                  mTemp.c2 = vPos.x;
                  aiMatrix4x4t<float>::operator*
                            (&local_170,(aiMatrix4x4t<float> *)local_130,
                             (aiMatrix4x4t<float> *)mTemp._56_8_);
                  memcpy((void *)mTemp._56_8_,&local_170,0x40);
                  *(ulong *)(mTemp._56_8_ + 0x80) = CONCAT44(vRot.z,vRot.y);
                  *(float *)(mTemp._56_8_ + 0x88) = vPos.x;
                  *(ulong *)(mTemp._56_8_ + 0x8c) = CONCAT44(iBone,bone._4_4_);
                  *(float *)(mTemp._56_8_ + 0x94) = vRot.x;
                  SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                  *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
                }
                else {
                  LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.z");
                  SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                  *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
                }
              }
              else {
                LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.y");
                SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
              }
            }
            else {
              LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.x");
              SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
              *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
            }
          }
          else {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.z");
            SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
            *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
          }
        }
        else {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.y");
          SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
          *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
        }
      }
      else {
        LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.x");
        SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
        *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
      }
    }
    else {
      LogErrorNoThrow(this,"Bone index in skeleton section is out of range");
      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
      *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
    }
  }
  else {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"Unexpected EOF/EOL while parsing bone index");
    SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
    *stack0xffffffffffffffe0 = (char *)szCurrentOut_local;
  }
  return;
}

Assistant:

void SMDImporter::ParseSkeletonElement(const char* szCurrent, const char** szCurrentOut,int iTime) {
    aiVector3D vPos;
    aiVector3D vRot;

    unsigned int iBone  = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iBone)) {
        ASSIMP_LOG_ERROR("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    if (iBone >= asBones.size()) {
        LogErrorNoThrow("Bone index in skeleton section is out of range");
        SMDI_PARSE_RETURN;
    }
    SMD::Bone& bone = asBones[iBone];

    bone.sAnim.asKeys.push_back(SMD::Bone::Animation::MatrixKey());
    SMD::Bone::Animation::MatrixKey& key = bone.sAnim.asKeys.back();

    key.dTime = (double)iTime;
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.z");
        SMDI_PARSE_RETURN;
    }
    // build the transformation matrix of the key
    key.matrix.FromEulerAnglesXYZ(vRot.x,vRot.y,vRot.z); {
        aiMatrix4x4 mTemp;
        mTemp.a4 = vPos.x;
        mTemp.b4 = vPos.y;
        mTemp.c4 = vPos.z;
        key.matrix = mTemp * key.matrix;
    }
    key.vPos = vPos;
    key.vRot = vRot;
    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}